

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O2

bool __thiscall ON_TextMask::Write(ON_TextMask *this,ON_BinaryArchive *archive)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmAnonymousChunk(archive,1);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::WriteBool(archive,this->m_bDrawMask);
    if ((((bVar1) && (bVar1 = ON_BinaryArchive::WriteInt(archive,(uint)this->m_mask_type), bVar1))
        && (bVar1 = ON_BinaryArchive::WriteColor(archive,&this->m_mask_color), bVar1)) &&
       (bVar1 = ON_BinaryArchive::WriteDouble(archive,this->m_mask_border), bVar1)) {
      bVar1 = ON_BinaryArchive::WriteInt(archive,(uint)this->m_mask_frame);
    }
    else {
      bVar1 = false;
    }
    bVar2 = ON_BinaryArchive::EndWrite3dmChunk(archive);
    return (bool)(bVar2 & bVar1);
  }
  return false;
}

Assistant:

bool ON_TextMask::Write(
  ON_BinaryArchive& archive
) const
{
  const int chunk_version = 1;  // Oct. 9, 2019 - mask_frame
  if (!archive.BeginWrite3dmAnonymousChunk(chunk_version))
    return false;

  bool rc = false;

  for (;;)
  {
    if (!archive.WriteBool(m_bDrawMask))
      break;
    const unsigned int mask_type_as_unsigned = (unsigned int)(static_cast<unsigned char>(m_mask_type));
    if (!archive.WriteInt(mask_type_as_unsigned))
      break;
    if (!archive.WriteColor(m_mask_color))
      break;
    if (!archive.WriteDouble(m_mask_border))
      break;
    // DO NOT write m_content_hash
    // END of chunk_version = 0 information

    const unsigned int mask_frame_as_unsigned = (unsigned int)(static_cast<unsigned char>(m_mask_frame));
    if (!archive.WriteInt(mask_frame_as_unsigned))
      break;
    // END of chunk_version = 1 information

    rc = true;
    break;
  }

  if (!archive.EndWrite3dmChunk())
    rc = false;
  return rc;
}